

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QPointF>::emplace<QPointF_const&>
          (QPodArrayOps<QPointF> *this,qsizetype i,QPointF *args)

{
  long lVar1;
  qreal qVar2;
  qreal qVar3;
  bool bVar4;
  qsizetype qVar5;
  QPointF *pQVar6;
  qreal *in_RDX;
  long in_RSI;
  QArrayDataPointer<QPointF> *in_RDI;
  long in_FS_OFFSET;
  QPointF *where;
  GrowthPosition pos;
  bool detach;
  QPointF tmp;
  QArrayDataPointer<QPointF> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar8;
  QArrayDataPointer<QPointF> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar4 = QArrayDataPointer<QPointF>::needsDetach(in_stack_ffffffffffffffc0);
  uVar8 = CONCAT13(bVar4,(int3)in_stack_ffffffffffffffcc);
  if (!bVar4) {
    if ((in_RSI == in_RDI->size) &&
       (qVar5 = QArrayDataPointer<QPointF>::freeSpaceAtEnd
                          ((QArrayDataPointer<QPointF> *)CONCAT44(uVar8,in_stack_ffffffffffffffc8)),
       qVar5 != 0)) {
      pQVar6 = QArrayDataPointer<QPointF>::end(in_stack_ffffffffffffffc0);
      pQVar6->xp = *in_RDX;
      pQVar6->yp = in_RDX[1];
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00719ecd;
    }
    if ((in_RSI == 0) &&
       (qVar5 = QArrayDataPointer<QPointF>::freeSpaceAtBegin
                          ((QArrayDataPointer<QPointF> *)CONCAT44(uVar8,in_stack_ffffffffffffffc8)),
       qVar5 != 0)) {
      pQVar6 = QArrayDataPointer<QPointF>::begin((QArrayDataPointer<QPointF> *)0x719df6);
      pQVar6[-1].xp = *in_RDX;
      pQVar6[-1].yp = in_RDX[1];
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00719ecd;
    }
  }
  qVar2 = *in_RDX;
  qVar3 = in_RDX[1];
  uVar7 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar7 = 1;
  }
  QArrayDataPointer<QPointF>::detachAndGrow
            (this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (QPointF **)CONCAT44(uVar8,uVar7),in_stack_ffffffffffffffc0);
  pQVar6 = createHole((QPodArrayOps<QPointF> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
                      (qsizetype)in_RDX,CONCAT44(uVar8,uVar7));
  pQVar6->xp = qVar2;
  pQVar6->yp = qVar3;
LAB_00719ecd:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }